

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O2

void print_net(string *tag,Net *xorNet,LabeledDataset *dataset)

{
  undefined8 xs;
  bool bVar1;
  ostream *poVar2;
  Array *__v;
  Array out;
  DatasetIterator __end1;
  allocator local_82;
  allocator local_81;
  valarray<float> local_80;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  local_80._M_size = (size_t)&std::cout;
  std::operator<<((ostream *)&std::cout,(string *)tag);
  std::__cxx11::string::string((string *)local_70," net:\n\n",&local_81);
  std::operator<<((ostream *)&std::cout,(string *)local_70);
  notch::io::PlainTextNetworkWriter::save((PlainTextNetworkWriter *)&local_80,xorNet);
  std::__cxx11::string::string((string *)local_50,"\n",&local_82);
  std::operator<<((ostream *)local_80._M_size,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)tag);
  std::operator<<(poVar2," out:\n");
  local_70._0_8_ =
       (dataset->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70._8_8_ =
       (dataset->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60._0_8_ =
       (dataset->outputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_60._8_8_ =
       (dataset->outputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_50._8_4_ = (undefined4)local_70._8_8_;
  local_50._12_4_ = (undefined4)((ulong)local_70._8_8_ >> 0x20);
  local_50._0_8_ = local_70._8_8_;
  local_50._24_4_ = (int)local_60._8_8_;
  local_50._16_8_ = local_60._8_8_;
  local_50._28_4_ = (int)((ulong)local_60._8_8_ >> 0x20);
  while( true ) {
    bVar1 = notch::core::LabeledDataset::DatasetIterator::operator!=
                      ((DatasetIterator *)local_70,(DatasetIterator *)local_50);
    if (!bVar1) break;
    xs = local_70._0_8_;
    __v = notch::core::Net::output(xorNet,(Array *)local_70._0_8_);
    notch::core::std::valarray<float>::valarray(&local_80,__v);
    notch::io::operator<<((ostream *)&std::cout,(Array *)xs);
    poVar2 = std::operator<<((ostream *)&std::cout," -> ");
    notch::io::operator<<(poVar2,&local_80);
    std::operator<<(poVar2,"\n");
    operator_delete(local_80._M_data);
    if ((local_70._0_8_ != local_70._8_8_) && (local_60._0_8_ != local_60._8_8_)) {
      local_70._0_8_ = (valarray<float> *)(local_70._0_8_ + 0x10);
      local_60._0_8_ = (valarray<float> *)(local_60._0_8_ + 0x10);
    }
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void print_net(string tag, Net &xorNet, LabeledDataset dataset) {
    PlainTextNetworkWriter(cout) << tag << " net:\n\n" << xorNet << "\n";
    cout << tag << " out:\n";
    for (auto s : dataset) {
        auto out = xorNet.output(s.data);
        cout << s.data << " -> " << out << "\n";
    }
    cout << "\n";
}